

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
          (BiDirectionalLSTMLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BiDirectionalLSTMLayerParams_00725c48;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->weightparams_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->weightparams_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->weightparams_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->weightparams_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (BiDirectionalLSTMLayerParams *)&_BiDirectionalLSTMLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 4) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 4) = 0;
  this->params_ = (LSTMParams *)0x0;
  this->inputvectorsize_ = 0;
  return;
}

Assistant:

BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.BiDirectionalLSTMLayerParams)
}